

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.h
# Opt level: O2

void std::
     __relocate_object_a<KDIS::DATA_TYPE::SilentAggregateSystem,KDIS::DATA_TYPE::SilentAggregateSystem,std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>>
               (SilentAggregateSystem *__dest,SilentAggregateSystem *__orig,
               allocator<KDIS::DATA_TYPE::SilentAggregateSystem> *__alloc)

{
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  (__dest->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__SilentAggregateSystem_0021aaa8;
  KVar1 = __orig->m_ui16Padding;
  __dest->m_ui16NumAggregates = __orig->m_ui16NumAggregates;
  __dest->m_ui16Padding = KVar1;
  (__dest->m_AggTyp).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AggregateType_00219948;
  KVar2 = (__orig->m_AggTyp).m_ui8Domain;
  KVar1 = (__orig->m_AggTyp).m_ui16Country;
  KVar3 = (__orig->m_AggTyp).m_ui8Category;
  KVar4 = (__orig->m_AggTyp).m_ui8SubCategory;
  KVar5 = (__orig->m_AggTyp).m_ui8Specific;
  KVar6 = (__orig->m_AggTyp).m_ui8Extra;
  (__dest->m_AggTyp).m_ui8Kind = (__orig->m_AggTyp).m_ui8Kind;
  (__dest->m_AggTyp).m_ui8Domain = KVar2;
  (__dest->m_AggTyp).m_ui16Country = KVar1;
  (__dest->m_AggTyp).m_ui8Category = KVar3;
  (__dest->m_AggTyp).m_ui8SubCategory = KVar4;
  (__dest->m_AggTyp).m_ui8Specific = KVar5;
  (__dest->m_AggTyp).m_ui8Extra = KVar6;
  (**(__orig->super_DataTypeBase)._vptr_DataTypeBase)(__orig);
  return;
}

Assistant:

class KDIS_EXPORT SilentAggregateSystem : public DataTypeBase
{
protected:

    KUINT16 m_ui16NumAggregates;

    KUINT16 m_ui16Padding;

    AggregateType m_AggTyp;

public:

    static const KUINT16 SILENT_AGGREGATE_SYSTEM_SIZE = 12;

    SilentAggregateSystem();

    SilentAggregateSystem(KDataStream &stream) noexcept(false);

    SilentAggregateSystem( KUINT16 NumAggregates, const AggregateType & T );

    virtual ~SilentAggregateSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::SetNumberOfAggregates
    //              KDIS::DATA_TYPE::SilentAggregateSystem::GetNumberOfAggregates
    // Description: Number of aggregates of this type.
    // Parameter:   KUINT16 NOA
    //************************************
    void SetNumberOfAggregates( KUINT16 NOA );
    KUINT16 GetNumberOfAggregates() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::SetAggregateType
    //              KDIS::DATA_TYPE::SilentAggregateSystem::GetAggregateType
    // Description: Aggregate type for this record.
    // Parameter:   const AggregateType & A, void
    //************************************
    void SetAggregateType( const AggregateType & A );
    const AggregateType & GetAggregateType() const;
    AggregateType & GetAggregateType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const SilentAggregateSystem & Value ) const;
    KBOOL operator != ( const SilentAggregateSystem & Value ) const;
}